

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::generate_parents
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *section,string *name)

{
  pointer pbVar1;
  char cVar2;
  pointer pcVar3;
  char *pcVar4;
  undefined8 *puVar5;
  pointer pbVar6;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar7;
  int iVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *parent;
  undefined8 *puVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_98 [17];
  undefined7 uStack_87;
  size_type sStack_80;
  undefined1 local_78 [8];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_70;
  pointer local_68;
  pointer local_60;
  undefined1 local_58 [32];
  undefined8 local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (section->_M_dataplus)._M_p;
  local_70 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  local_68 = (pointer)local_58;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + section->_M_string_length);
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
            (local_68,(undefined1 *)
                      ((long)&(local_60->_M_dataplus)._M_p + (long)&(local_68->_M_dataplus)._M_p),
             local_68);
  pbVar1 = (pointer)(local_98 + 0x10);
  if (local_68 == (pointer)local_58) {
    sStack_80 = local_58._8_8_;
    local_98._0_8_ = pbVar1;
  }
  else {
    local_98._0_8_ = local_68;
  }
  stack0xffffffffffffff78 = (pointer)CONCAT71(local_58._1_7_,local_58[0]);
  local_98._8_8_ = local_60;
  local_60 = (pointer)0x0;
  local_58[0] = 0;
  local_68 = (pointer)local_58;
  iVar8 = ::std::__cxx11::string::compare(local_98);
  if ((pointer)local_98._0_8_ != pbVar1) {
    operator_delete((void *)local_98._0_8_);
  }
  if (local_68 != (pointer)local_58) {
    operator_delete(local_68);
  }
  pvVar7 = local_70;
  if (iVar8 != 0) {
    lVar9 = ::std::__cxx11::string::find((char)section,0x2e);
    if (lVar9 == -1) {
      pcVar3 = (section->_M_dataplus)._M_p;
      local_98._0_8_ = pbVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar3,pcVar3 + section->_M_string_length);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>(pvVar7,local_98,local_78);
      if ((pointer)local_98._0_8_ != pbVar1) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    else {
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_58 + 0x10),section,'.');
      local_98._0_8_ = *(undefined8 *)pvVar7;
      local_98._8_8_ = *(undefined8 *)(pvVar7 + 8);
      unique0x10000330 = *(pointer *)(pvVar7 + 0x10);
      *(undefined8 *)pvVar7 = local_58._16_8_;
      *(undefined8 *)(pvVar7 + 8) = local_58._24_8_;
      *(undefined8 *)(pvVar7 + 0x10) = local_38;
      local_58._16_8_ = 0;
      local_58._24_8_ = 0;
      local_38 = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_58 + 0x10));
    }
  }
  lVar9 = ::std::__cxx11::string::find((char)name,0x2e);
  if (lVar9 != -1) {
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_98,name,'.');
    ::std::__cxx11::string::_M_assign((string *)name);
    if (1 < name->_M_string_length) {
      pcVar4 = (name->_M_dataplus)._M_p;
      cVar2 = *pcVar4;
      if (((cVar2 == '\'') || (cVar2 == '\"')) && (cVar2 == pcVar4[name->_M_string_length - 1])) {
        ::std::__cxx11::string::pop_back();
        if (name->_M_string_length == 1) {
          pcVar3 = (name->_M_dataplus)._M_p;
          name->_M_string_length = 0;
          *pcVar3 = '\0';
        }
        else {
          ::std::__cxx11::string::_M_erase((ulong)name,0);
        }
      }
    }
    pbVar1 = (pointer)(local_98._8_8_ + -0x20);
    pcVar3 = (((pointer)(local_98._8_8_ + -0x20))->_M_dataplus)._M_p;
    pbVar6 = (pointer)(local_98._8_8_ + -0x20);
    local_98._8_8_ = pbVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar6->field_2) {
      operator_delete(pcVar3);
    }
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (pvVar7,*(undefined8 *)(pvVar7 + 8),local_98._0_8_,local_98._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
  }
  puVar5 = *(undefined8 **)(pvVar7 + 8);
  for (puVar10 = *(undefined8 **)pvVar7; puVar10 != puVar5; puVar10 = puVar10 + 4) {
    if (1 < (ulong)puVar10[1]) {
      cVar2 = *(char *)*puVar10;
      if (((cVar2 == '\'') || (cVar2 == '\"')) && (cVar2 == ((char *)*puVar10)[puVar10[1] - 1])) {
        ::std::__cxx11::string::pop_back();
        if (puVar10[1] == 1) {
          puVar10[1] = 0;
          *(undefined1 *)*puVar10 = 0;
        }
        else {
          ::std::__cxx11::string::_M_erase((ulong)puVar10,0);
        }
      }
    }
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)pvVar7;
}

Assistant:

inline std::vector<std::string> generate_parents(const std::string &section, std::string &name) {
    std::vector<std::string> parents;
    if(detail::to_lower(section) != "default") {
        if(section.find('.') != std::string::npos) {
            parents = detail::split(section, '.');
        } else {
            parents = {section};
        }
    }
    if(name.find('.') != std::string::npos) {
        std::vector<std::string> plist = detail::split(name, '.');
        name = plist.back();
        detail::remove_quotes(name);
        plist.pop_back();
        parents.insert(parents.end(), plist.begin(), plist.end());
    }

    // clean up quotes on the parents
    for(auto &parent : parents) {
        detail::remove_quotes(parent);
    }
    return parents;
}